

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_split.c
# Opt level: O3

REF_STATUS ref_split_edge_pattern(REF_GRID ref_grid,REF_INT first,REF_INT skip)

{
  REF_INT node0;
  REF_INT node1;
  REF_NODE ref_node;
  uint uVar1;
  undefined8 uVar2;
  char *pcVar3;
  long lVar4;
  REF_INT new_node;
  REF_BOOL allowed;
  REF_EDGE ref_edge;
  REF_GLOB global;
  REF_INT local_50;
  int local_4c;
  REF_EDGE local_48;
  long local_40;
  REF_GLOB local_38;
  
  ref_node = ref_grid->node;
  uVar1 = ref_edge_create(&local_48,ref_grid);
  if (uVar1 == 0) {
    if (first < local_48->n) {
      lVar4 = (long)first;
      local_40 = (long)skip;
      do {
        node0 = local_48->e2n[lVar4 * 2];
        node1 = local_48->e2n[lVar4 * 2 + 1];
        uVar1 = ref_cell_has_side(ref_grid->cell[8],node0,node1,&local_4c);
        if (uVar1 != 0) {
          pcVar3 = "has side";
          uVar2 = 0x389;
          goto LAB_001db3aa;
        }
        if (local_4c != 0) {
          uVar1 = ref_split_edge_mixed(ref_grid,node0,node1,&local_4c);
          if (uVar1 != 0) {
            pcVar3 = "mixed";
            uVar2 = 0x38c;
            goto LAB_001db3aa;
          }
          if (local_4c != 0) {
            uVar1 = ref_cell_local_gem(ref_grid->cell[8],ref_node,node0,node1,&local_4c);
            if (uVar1 != 0) {
              pcVar3 = "local tet";
              uVar2 = 0x391;
              goto LAB_001db3aa;
            }
            if (local_4c != 0) {
              uVar1 = ref_node_next_global(ref_node,&local_38);
              if (uVar1 != 0) {
                pcVar3 = "next global";
                uVar2 = 0x394;
                goto LAB_001db3aa;
              }
              uVar1 = ref_node_add(ref_node,local_38,&local_50);
              if (uVar1 != 0) {
                pcVar3 = "new node";
                uVar2 = 0x395;
                goto LAB_001db3aa;
              }
              uVar1 = ref_node_interpolate_edge(ref_node,node0,node1,0.5,local_50);
              if (uVar1 != 0) {
                pcVar3 = "interp new node";
                uVar2 = 0x397;
                goto LAB_001db3aa;
              }
              uVar1 = ref_geom_add_between(ref_grid,node0,node1,0.5,local_50);
              if (uVar1 != 0) {
                pcVar3 = "geom new node";
                uVar2 = 0x399;
                goto LAB_001db3aa;
              }
              uVar1 = ref_geom_constrain(ref_grid,local_50);
              if (uVar1 != 0) {
                pcVar3 = "geom constraint";
                uVar2 = 0x39a;
                goto LAB_001db3aa;
              }
              uVar1 = ref_metric_interpolate_between(ref_grid,node0,node1,local_50);
              if (uVar1 != 0) {
                pcVar3 = "interp new node metric";
                uVar2 = 0x39c;
                goto LAB_001db3aa;
              }
              uVar1 = ref_split_edge(ref_grid,node0,node1,local_50);
              if (uVar1 != 0) {
                pcVar3 = "split";
                uVar2 = 0x39e;
                goto LAB_001db3aa;
              }
            }
          }
        }
        lVar4 = lVar4 + local_40;
      } while (lVar4 < local_48->n);
    }
    ref_edge_free(local_48);
    uVar1 = 0;
  }
  else {
    pcVar3 = "orig edges";
    uVar2 = 899;
LAB_001db3aa:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",uVar2,
           "ref_split_edge_pattern",(ulong)uVar1,pcVar3);
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_split_edge_pattern(REF_GRID ref_grid, REF_INT first,
                                          REF_INT skip) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_EDGE ref_edge;
  REF_INT edge;
  REF_BOOL allowed;
  REF_GLOB global;
  REF_INT node0, node1;
  REF_INT new_node;

  RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");

  for (edge = first; edge < ref_edge_n(ref_edge); edge += skip) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    RSS(ref_cell_has_side(ref_grid_tet(ref_grid), node0, node1, &allowed),
        "has side");
    if (!allowed) continue;

    RSS(ref_split_edge_mixed(ref_grid, node0, node1, &allowed), "mixed");
    if (!allowed) continue;

    RSS(ref_cell_local_gem(ref_grid_tet(ref_grid), ref_node, node0, node1,
                           &allowed),
        "local tet");
    if (!allowed) continue;

    RSS(ref_node_next_global(ref_node, &global), "next global");
    RSS(ref_node_add(ref_node, global, &new_node), "new node");
    RSS(ref_node_interpolate_edge(ref_node, node0, node1, 0.5, new_node),
        "interp new node");
    RSS(ref_geom_add_between(ref_grid, node0, node1, 0.5, new_node),
        "geom new node");
    RSS(ref_geom_constrain(ref_grid, new_node), "geom constraint");
    RSS(ref_metric_interpolate_between(ref_grid, node0, node1, new_node),
        "interp new node metric");

    RSS(ref_split_edge(ref_grid, node0, node1, new_node), "split");
  }

  ref_edge_free(ref_edge);

  return REF_SUCCESS;
}